

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

char * __thiscall
flatbuffers::JsonPrinter::GenFieldOffset
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent,uint8_t *prev_val)

{
  BaseType BVar1;
  Vector<unsigned_char,_unsigned_int> *pVVar2;
  char *pcVar3;
  undefined7 in_register_00000009;
  Table *val;
  Reference root;
  
  if ((int)CONCAT71(in_register_00000009,fixed) == 0) {
    if ((fd->flexbuffer == true) && (this->opts->json_nested_flexbuffers == true)) {
      pVVar2 = Table::GetPointer<flatbuffers::Vector<unsigned_char,unsigned_int>const*,unsigned_int>
                         (table,(fd->value).offset);
      root = flexbuffers::GetRoot((uint8_t *)(pVVar2 + 4),(ulong)*(uint *)pVVar2);
      flexbuffers::Reference::ToString(&root,true,this->opts->strict_json,this->text);
      return (char *)0x0;
    }
    if ((fd->nested_flatbuffer != (StructDef *)0x0) && (this->opts->json_nested_flatbuffers == true)
       ) {
      pVVar2 = Table::GetPointer<flatbuffers::Vector<unsigned_char,unsigned_int>const*,unsigned_int>
                         (table,(fd->value).offset);
      pcVar3 = GenStruct(this,fd->nested_flatbuffer,
                         (Table *)(pVVar2 + (ulong)*(uint *)(pVVar2 + 4) + 4),indent);
      return pcVar3;
    }
    if (((fd->value).type.base_type == BASE_TYPE_STRUCT) &&
       (((fd->value).type.struct_def)->fixed == true)) {
      val = (Table *)Table::GetStruct<void_const*>(table,(fd->value).offset);
    }
    else {
      val = (Table *)Table::GetPointer<void_const*,unsigned_int>(table,(fd->value).offset);
    }
  }
  else {
    BVar1 = (fd->value).type.base_type;
    if ((BVar1 != BASE_TYPE_ARRAY) &&
       ((BVar1 != BASE_TYPE_STRUCT || (((fd->value).type.struct_def)->fixed == false)))) {
      __assert_fail("IsStruct(fd.value.type) || IsArray(fd.value.type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                    ,0x11a,
                    "const char *flatbuffers::JsonPrinter::GenFieldOffset(const FieldDef &, const Table *, bool, int, const uint8_t *)"
                   );
    }
    val = table + (fd->value).offset;
  }
  pcVar3 = PrintOffset(this,val,&(fd->value).type,indent,prev_val,-1);
  return pcVar3;
}

Assistant:

const char *GenFieldOffset(const FieldDef &fd, const Table *table, bool fixed,
                             int indent, const uint8_t *prev_val) {
    const void *val = nullptr;
    if (fixed) {
      // The only non-scalar fields in structs are structs or arrays.
      FLATBUFFERS_ASSERT(IsStruct(fd.value.type) || IsArray(fd.value.type));
      val = reinterpret_cast<const Struct *>(table)->GetStruct<const void *>(
          fd.value.offset);
    } else if (fd.flexbuffer && opts.json_nested_flexbuffers) {
      // We could verify this FlexBuffer before access, but since this sits
      // inside a FlatBuffer that we don't know wether it has been verified or
      // not, there is little point making this part safer than the parent..
      // The caller should really be verifying the whole.
      // If the whole buffer is corrupt, we likely crash before we even get
      // here.
      auto vec = table->GetPointer<const Vector<uint8_t> *>(fd.value.offset);
      auto root = flexbuffers::GetRoot(vec->data(), vec->size());
      root.ToString(true, opts.strict_json, text);
      return nullptr;
    } else if (fd.nested_flatbuffer && opts.json_nested_flatbuffers) {
      auto vec = table->GetPointer<const Vector<uint8_t> *>(fd.value.offset);
      auto root = GetRoot<Table>(vec->data());
      return GenStruct(*fd.nested_flatbuffer, root, indent);
    } else {
      val = IsStruct(fd.value.type)
                ? table->GetStruct<const void *>(fd.value.offset)
                : table->GetPointer<const void *>(fd.value.offset);
    }
    return PrintOffset(val, fd.value.type, indent, prev_val, -1);
  }